

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall
c4::yml::
Emitter<c4::yml::WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::_write(Emitter<c4::yml::WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *this,NodeScalar *sc,NodeType flags,size_t ilevel)

{
  Location LVar1;
  Location LVar2;
  csubstr sp;
  csubstr sp_00;
  csubstr tag;
  Location loc;
  Location loc_00;
  csubstr s;
  csubstr s_00;
  csubstr s_01;
  ro_substr chars;
  csubstr s_02;
  bool bVar3;
  error_flags eVar4;
  int iVar5;
  Callbacks *pCVar6;
  ulong in_RDX;
  long *in_RSI;
  Emitter<c4::yml::WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  char msg_1 [16];
  size_t i;
  bool do_literal;
  bool has_leading_ws;
  bool all_newlines;
  size_t first_non_nl;
  type_bits style_marks;
  char msg [133];
  undefined7 in_stack_fffffffffffffc18;
  char in_stack_fffffffffffffc1f;
  WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffc20;
  undefined7 in_stack_fffffffffffffc28;
  char in_stack_fffffffffffffc2f;
  Location *in_stack_fffffffffffffc30;
  char *in_stack_fffffffffffffc38;
  undefined7 in_stack_fffffffffffffc40;
  char in_stack_fffffffffffffc47;
  basic_substring<const_char> *in_stack_fffffffffffffc48;
  char *pcVar7;
  undefined5 in_stack_fffffffffffffc70;
  undefined1 in_stack_fffffffffffffc75;
  undefined1 in_stack_fffffffffffffc76;
  undefined1 in_stack_fffffffffffffc77;
  undefined2 in_stack_fffffffffffffc80;
  undefined1 in_stack_fffffffffffffc82;
  undefined1 in_stack_fffffffffffffc83;
  undefined4 in_stack_fffffffffffffc84;
  size_t in_stack_fffffffffffffc88;
  undefined7 in_stack_fffffffffffffc90;
  undefined1 in_stack_fffffffffffffc97;
  basic_substring<const_char> *in_stack_fffffffffffffc98;
  size_t in_stack_fffffffffffffca0;
  pfn_error p_Var8;
  undefined7 in_stack_fffffffffffffcb0;
  undefined1 in_stack_fffffffffffffcb7;
  undefined7 in_stack_fffffffffffffcc8;
  undefined1 uVar9;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  size_t local_310;
  char local_308 [7];
  char was_quoted;
  Emitter<c4::yml::WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd00;
  size_t in_stack_fffffffffffffd08;
  Emitter<c4::yml::WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd10;
  char *in_stack_fffffffffffffd18;
  size_t in_stack_fffffffffffffd20;
  undefined8 in_stack_fffffffffffffd28;
  undefined2 uVar11;
  ulong uVar10;
  size_t in_stack_fffffffffffffd30;
  Emitter<c4::yml::WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd38;
  basic_substring<const_char> in_stack_fffffffffffffd40;
  undefined7 in_stack_fffffffffffffd50;
  undefined1 in_stack_fffffffffffffd57;
  char *in_stack_fffffffffffffd58;
  size_t local_2a0;
  basic_substring<const_char> local_298;
  undefined1 local_282;
  byte local_281;
  size_t local_280;
  long local_278;
  long local_270;
  long local_268;
  long local_260;
  long local_258;
  long local_250;
  long local_248;
  long local_240;
  size_t in_stack_fffffffffffffdc8;
  Emitter<c4::yml::WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffdd0;
  size_t in_stack_fffffffffffffde0;
  WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pWStack_218;
  undefined8 local_210;
  Location *pLStack_208;
  char *local_200;
  char local_1f8 [144];
  long local_168;
  long local_160;
  long local_158;
  long local_150;
  undefined8 local_148;
  char cStack_141;
  WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pWStack_140;
  undefined8 local_138;
  Location *pLStack_130;
  char *local_128;
  undefined8 local_120;
  WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pWStack_118;
  undefined8 local_110;
  Location *pLStack_108;
  char *local_100;
  long local_f8;
  long local_f0;
  long *local_e0;
  ulong local_d0;
  ulong *local_c8;
  ulong *local_c0;
  ulong *local_b8;
  ulong *local_b0;
  undefined1 *local_a8;
  long *local_a0;
  long *local_98;
  ulong *local_88;
  ulong *local_80;
  ulong *local_78;
  ulong *local_70;
  char *local_68;
  long *local_60;
  ulong *local_58;
  ulong *local_50;
  ulong *local_48;
  ulong *local_40;
  char *local_38;
  undefined4 local_30;
  size_t local_28;
  long *local_20;
  char *local_18;
  size_t local_10;
  ulong *local_8;
  
  was_quoted = (char)((ulong)_local_308 >> 0x38);
  uVar11 = (undefined2)((ulong)in_stack_fffffffffffffd28 >> 0x30);
  uVar9 = true;
  if (in_RSI[1] != 0) {
    uVar9 = *in_RSI == 0;
  }
  local_e0 = in_RSI;
  local_d0 = in_RDX;
  if ((bool)uVar9 == false) {
    local_f8 = *in_RSI;
    local_f0 = in_RSI[1];
    tag.len._0_7_ = in_stack_fffffffffffffc40;
    tag.str = in_stack_fffffffffffffc38;
    tag.len._7_1_ = in_stack_fffffffffffffc47;
    _write_tag((Emitter<c4::yml::WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffc30,tag);
    WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_do_write(in_stack_fffffffffffffc20,in_stack_fffffffffffffc1f);
  }
  local_80 = &local_d0;
  if ((local_d0 & 0x300) == 0) {
    local_78 = &local_d0;
    if ((local_d0 & 0xc0) != 0) {
      local_60 = local_e0 + 4;
      local_68 = "<<";
      iVar5 = basic_substring<const_char>::compare
                        (in_stack_fffffffffffffc98,
                         (char *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),
                         in_stack_fffffffffffffc88);
      if (iVar5 != 0) {
        WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_do_write(in_stack_fffffffffffffc20,in_stack_fffffffffffffc1f);
      }
      local_168 = local_e0[4];
      local_160 = local_e0[5];
      sp_00.len = (size_t)in_stack_fffffffffffffc38;
      sp_00.str = (char *)in_stack_fffffffffffffc30;
      WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_do_write((WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)CONCAT17(in_stack_fffffffffffffc2f,in_stack_fffffffffffffc28),sp_00);
      return;
    }
  }
  else {
    local_70 = &local_d0;
    local_88 = &local_d0;
    if (((local_d0 & 0xc0) != 0) == ((local_d0 & 0x300) != 0)) {
      eVar4 = get_error_flags();
      if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
        trap_instruction();
      }
      Location::Location(in_stack_fffffffffffffc30,
                         (char *)CONCAT17(in_stack_fffffffffffffc2f,in_stack_fffffffffffffc28),
                         (size_t)in_stack_fffffffffffffc20,
                         CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18));
      in_stack_fffffffffffffc28 = (undefined7)local_110;
      in_stack_fffffffffffffc2f = (char)((ulong)local_110 >> 0x38);
      in_stack_fffffffffffffc18 = (undefined7)local_120;
      in_stack_fffffffffffffc1f = (char)((ulong)local_120 >> 0x38);
      loc.super_LineCol.offset._2_1_ = in_stack_fffffffffffffc82;
      loc.super_LineCol.offset._0_2_ = in_stack_fffffffffffffc80;
      loc.super_LineCol.offset._3_1_ = in_stack_fffffffffffffc83;
      loc.super_LineCol.offset._4_4_ = in_stack_fffffffffffffc84;
      loc.super_LineCol.line = in_stack_fffffffffffffc88;
      loc.super_LineCol.col._0_7_ = in_stack_fffffffffffffc90;
      loc.super_LineCol.col._7_1_ = in_stack_fffffffffffffc97;
      loc.name.str = (char *)in_stack_fffffffffffffc98;
      loc.name.len = in_stack_fffffffffffffca0;
      error<51ul>((char (*) [51])
                  CONCAT17(in_stack_fffffffffffffc77,
                           CONCAT16(in_stack_fffffffffffffc76,
                                    CONCAT15(in_stack_fffffffffffffc75,in_stack_fffffffffffffc70))),
                  loc);
      in_stack_fffffffffffffc20 = pWStack_118;
      in_stack_fffffffffffffc30 = pLStack_108;
      in_stack_fffffffffffffc38 = local_100;
    }
    local_98 = local_e0 + 4;
    in_stack_fffffffffffffcb7 = true;
    if (local_e0[5] != 0) {
      in_stack_fffffffffffffcb7 = *local_98 == 0;
    }
    if ((bool)in_stack_fffffffffffffcb7 != false) {
      eVar4 = get_error_flags();
      if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
        trap_instruction();
      }
      Location::Location(in_stack_fffffffffffffc30,
                         (char *)CONCAT17(in_stack_fffffffffffffc2f,in_stack_fffffffffffffc28),
                         (size_t)in_stack_fffffffffffffc20,
                         CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18));
      in_stack_fffffffffffffc28 = (undefined7)local_138;
      in_stack_fffffffffffffc2f = (char)((ulong)local_138 >> 0x38);
      loc_00.super_LineCol.offset._2_1_ = in_stack_fffffffffffffc82;
      loc_00.super_LineCol.offset._0_2_ = in_stack_fffffffffffffc80;
      loc_00.super_LineCol.offset._3_1_ = in_stack_fffffffffffffc83;
      loc_00.super_LineCol.offset._4_4_ = in_stack_fffffffffffffc84;
      loc_00.super_LineCol.line = in_stack_fffffffffffffc88;
      loc_00.super_LineCol.col._0_7_ = in_stack_fffffffffffffc90;
      loc_00.super_LineCol.col._7_1_ = in_stack_fffffffffffffc97;
      loc_00.name.str = (char *)in_stack_fffffffffffffc98;
      loc_00.name.len = in_stack_fffffffffffffca0;
      error<34ul>((char (*) [34])
                  CONCAT17(in_stack_fffffffffffffc77,
                           CONCAT16(in_stack_fffffffffffffc76,
                                    CONCAT15(in_stack_fffffffffffffc75,in_stack_fffffffffffffc70))),
                  loc_00);
      in_stack_fffffffffffffc1f = cStack_141;
      in_stack_fffffffffffffc20 = pWStack_140;
      in_stack_fffffffffffffc30 = pLStack_130;
      in_stack_fffffffffffffc38 = local_128;
    }
    WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_do_write(in_stack_fffffffffffffc20,in_stack_fffffffffffffc1f);
    local_158 = local_e0[4];
    local_150 = local_e0[5];
    sp.len = (size_t)in_stack_fffffffffffffc38;
    sp.str = (char *)in_stack_fffffffffffffc30;
    WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_do_write((WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)CONCAT17(in_stack_fffffffffffffc2f,in_stack_fffffffffffffc28),sp);
    WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_do_write(in_stack_fffffffffffffc20,in_stack_fffffffffffffc1f);
  }
  local_40 = &local_d0;
  if ((local_d0 & 0x7fe0000) != 0) {
    local_48 = &local_d0;
    local_50 = &local_d0;
    if (((local_d0 & 0x2aa0000) == 0) == ((local_d0 & 0x5540000) == 0)) {
      memcpy(local_1f8,
             "check failed: (((flags & (_WIP_KEY_STYLE|_WIP_VAL_STYLE)) == 0) || (((flags&_WIP_KEY_STYLE) == 0) != ((flags&_WIP_VAL_STYLE) == 0)))"
             ,0x85);
      eVar4 = get_error_flags();
      if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
        trap_instruction();
      }
      pCVar6 = Tree::callbacks(in_RDI->m_tree);
      p_Var8 = pCVar6->m_error;
      pcVar7 = local_1f8;
      Location::Location((Location *)CONCAT17(in_stack_fffffffffffffc47,in_stack_fffffffffffffc40),
                         in_stack_fffffffffffffc38,(size_t)in_stack_fffffffffffffc30,
                         CONCAT17(in_stack_fffffffffffffc2f,in_stack_fffffffffffffc28),
                         (size_t)in_stack_fffffffffffffc20);
      pCVar6 = Tree::callbacks(in_RDI->m_tree);
      in_stack_fffffffffffffc28 = (undefined7)local_210;
      in_stack_fffffffffffffc2f = (char)((ulong)local_210 >> 0x38);
      LVar1.super_LineCol.line = (size_t)pWStack_218;
      LVar1.super_LineCol.offset = in_stack_fffffffffffffde0;
      LVar1.super_LineCol.col._0_7_ = in_stack_fffffffffffffc28;
      LVar1.super_LineCol.col._7_1_ = in_stack_fffffffffffffc2f;
      LVar1.name.str = (char *)pLStack_208;
      LVar1.name.len = (size_t)local_200;
      (*p_Var8)(pcVar7,0x85,LVar1,pCVar6->m_user_data);
      in_stack_fffffffffffffc20 = pWStack_218;
      in_stack_fffffffffffffc30 = pLStack_208;
      in_stack_fffffffffffffc38 = local_200;
    }
  }
  local_58 = &local_d0;
  if ((local_d0 & 0x60000) == 0) {
    if ((local_d0 & 0x180000) == 0) {
      if ((local_d0 & 0x600000) == 0) {
        if ((local_d0 & 0x1800000) == 0) {
          if ((local_d0 & 0x6000000) == 0) {
            if ((char *)(local_d0 & 0x7fe0000) == (char *)0x0) {
              local_280 = basic_substring<const_char>::first_not_of
                                    (in_stack_fffffffffffffc48,in_stack_fffffffffffffc47,
                                     (size_t)in_stack_fffffffffffffc38);
              local_281 = local_280 == 0xffffffffffffffff;
              local_282 = false;
              if (!(bool)local_281) {
                local_20 = local_e0 + 2;
                local_28 = local_280;
                if ((ulong)local_e0[3] < local_280) {
                  eVar4 = get_error_flags();
                  if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
                    trap_instruction();
                  }
                  local_38 = 
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                  ;
                  local_30 = 0x1533;
                  handle_error(0x3f0daf,(char *)0x1533,"check failed: %s",
                               "first >= 0 && first <= len");
                }
                basic_substring<const_char>::basic_substring
                          ((basic_substring<const_char> *)
                           CONCAT17(in_stack_fffffffffffffc47,in_stack_fffffffffffffc40),
                           in_stack_fffffffffffffc38,(size_t)in_stack_fffffffffffffc30);
                local_298.str = local_18;
                local_298.len = local_10;
                basic_substring<char_const>::basic_substring<3ul>
                          ((basic_substring<char_const> *)&stack0xfffffffffffffd58,
                           (char (*) [3])" \t");
                chars.len = local_2a0;
                chars.str = in_stack_fffffffffffffd58;
                local_282 = basic_substring<const_char>::begins_with_any(&local_298,chars);
              }
              local_a0 = local_e0 + 2;
              bVar3 = true;
              if (local_e0[3] != 0) {
                bVar3 = *local_a0 == 0;
              }
              if (((bVar3) || (bVar3 = true, (local_281 & 1) == 0)) &&
                 (bVar3 = false, (bool)local_282 != false)) {
                in_stack_fffffffffffffd40 =
                     basic_substring<const_char>::trim
                               ((basic_substring<const_char> *)in_stack_fffffffffffffc30,
                                in_stack_fffffffffffffc2f);
                local_a8 = &stack0xfffffffffffffd40;
                bVar3 = in_stack_fffffffffffffd40.len != 0 &&
                        in_stack_fffffffffffffd40.str != (char *)0x0;
              }
              if (bVar3) {
                local_c0 = &local_d0;
                _write_scalar_literal
                          ((Emitter<c4::yml::WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_e0[3],in_stack_fffffffffffffd40,local_e0[2],
                           SUB21((ushort)uVar11 >> 8,0),SUB21(uVar11,0));
              }
              else {
                for (uVar10 = 0; uVar10 < (ulong)local_e0[3]; uVar10 = uVar10 + 1) {
                  if (*(char *)(local_e0[2] + uVar10) == '\n') {
                    local_c8 = &local_d0;
                    _write_scalar_literal
                              (in_stack_fffffffffffffd38,in_stack_fffffffffffffd40,
                               in_stack_fffffffffffffd30,SUB81(uVar10 >> 0x38,0),
                               SUB81(uVar10 >> 0x30,0));
                    return;
                  }
                }
                local_8 = &local_d0;
                _write_scalar(in_stack_fffffffffffffd00,*(csubstr *)(local_e0 + 2),(bool)was_quoted)
                ;
              }
            }
            else {
              builtin_strncpy(local_308,"not imp",7);
              was_quoted = 'l';
              eVar4 = get_error_flags();
              if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
                trap_instruction();
              }
              pCVar6 = Tree::callbacks(in_RDI->m_tree);
              p_Var8 = pCVar6->m_error;
              pcVar7 = local_308;
              Location::Location((Location *)
                                 CONCAT17(in_stack_fffffffffffffc47,in_stack_fffffffffffffc40),
                                 in_stack_fffffffffffffc38,(size_t)in_stack_fffffffffffffc30,
                                 CONCAT17(in_stack_fffffffffffffc2f,in_stack_fffffffffffffc28),
                                 (size_t)in_stack_fffffffffffffc20);
              pCVar6 = Tree::callbacks(in_RDI->m_tree);
              LVar2.super_LineCol.line = uStack_328;
              LVar2.super_LineCol.offset = local_330;
              LVar2.super_LineCol.col._0_7_ = (int7)local_320;
              LVar2.super_LineCol.col._7_1_ = (char)((ulong)local_320 >> 0x38);
              LVar2.name.str = (char *)uStack_318;
              LVar2.name.len = local_310;
              (*p_Var8)(pcVar7,0x10,LVar2,pCVar6->m_user_data);
            }
          }
          else {
            local_278 = local_e0[2];
            local_270 = local_e0[3];
            s.len._0_7_ = in_stack_fffffffffffffcc8;
            s.str = (char *)in_RSI;
            s.len._7_1_ = uVar9;
            _write_scalar_plain(in_RDI,s,CONCAT17(in_stack_fffffffffffffcb7,
                                                  in_stack_fffffffffffffcb0));
          }
        }
        else {
          local_268 = local_e0[2];
          local_260 = local_e0[3];
          s_02.len = in_stack_fffffffffffffde0;
          s_02.str = (char *)(local_d0 & 0x7fe0000);
          _write_scalar_dquo(in_stack_fffffffffffffdd0,s_02,in_stack_fffffffffffffdc8);
        }
      }
      else {
        local_258 = local_e0[2];
        local_250 = local_e0[3];
        s_00.len = in_stack_fffffffffffffd20;
        s_00.str = in_stack_fffffffffffffd18;
        _write_scalar_squo(in_stack_fffffffffffffd10,s_00,in_stack_fffffffffffffd08);
      }
    }
    else {
      local_248 = local_e0[2];
      local_240 = local_e0[3];
      local_b8 = &local_d0;
      s_01.str._7_1_ = in_stack_fffffffffffffd57;
      s_01.str._0_7_ = in_stack_fffffffffffffd50;
      s_01.len = (size_t)in_stack_fffffffffffffd58;
      _write_scalar_folded
                ((Emitter<c4::yml::WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffd40.len,s_01,(size_t)in_stack_fffffffffffffd40.str,
                 SUB81((ulong)in_stack_fffffffffffffd38 >> 0x38,0));
    }
  }
  else {
    local_b0 = &local_d0;
    _write_scalar_literal
              (in_stack_fffffffffffffd38,in_stack_fffffffffffffd40,in_stack_fffffffffffffd30,
               SUB21((ushort)uVar11 >> 8,0),SUB21(uVar11,0));
  }
  return;
}

Assistant:

void Emitter<Writer>::_write(NodeScalar const& C4_RESTRICT sc, NodeType flags, size_t ilevel)
{
    if( ! sc.tag.empty())
    {
        _write_tag(sc.tag);
        this->Writer::_do_write(' ');
    }
    if(flags.has_anchor())
    {
        RYML_ASSERT(flags.is_ref() != flags.has_anchor());
        RYML_ASSERT( ! sc.anchor.empty());
        this->Writer::_do_write('&');
        this->Writer::_do_write(sc.anchor);
        this->Writer::_do_write(' ');
    }
    else if(flags.is_ref())
    {
        if(sc.anchor != "<<")
            this->Writer::_do_write('*');
        this->Writer::_do_write(sc.anchor);
        return;
    }

    // ensure the style flags only have one of KEY or VAL
    _RYML_CB_ASSERT(m_tree->callbacks(), ((flags & (_WIP_KEY_STYLE|_WIP_VAL_STYLE)) == 0) || (((flags&_WIP_KEY_STYLE) == 0) != ((flags&_WIP_VAL_STYLE) == 0)));

    auto style_marks = flags & (_WIP_KEY_STYLE|_WIP_VAL_STYLE);
    if(style_marks & (_WIP_KEY_LITERAL|_WIP_VAL_LITERAL))
    {
        _write_scalar_literal(sc.scalar, ilevel, flags.has_key());
    }
    else if(style_marks & (_WIP_KEY_FOLDED|_WIP_VAL_FOLDED))
    {
        _write_scalar_folded(sc.scalar, ilevel, flags.has_key());
    }
    else if(style_marks & (_WIP_KEY_SQUO|_WIP_VAL_SQUO))
    {
        _write_scalar_squo(sc.scalar, ilevel);
    }
    else if(style_marks & (_WIP_KEY_DQUO|_WIP_VAL_DQUO))
    {
        _write_scalar_dquo(sc.scalar, ilevel);
    }
    else if(style_marks & (_WIP_KEY_PLAIN|_WIP_VAL_PLAIN))
    {
        _write_scalar_plain(sc.scalar, ilevel);
    }
    else if(!style_marks)
    {
        size_t first_non_nl = sc.scalar.first_not_of('\n');
        bool all_newlines = first_non_nl == npos;
        bool has_leading_ws = (!all_newlines) && sc.scalar.sub(first_non_nl).begins_with_any(" \t");
        bool do_literal = ((!sc.scalar.empty() && all_newlines) || (has_leading_ws && !sc.scalar.trim(' ').empty()));
        if(do_literal)
        {
            _write_scalar_literal(sc.scalar, ilevel, flags.has_key(), /*explicit_indentation*/has_leading_ws);
        }
        else
        {
            for(size_t i = 0; i < sc.scalar.len; ++i)
            {
                if(sc.scalar.str[i] == '\n')
                {
                    _write_scalar_literal(sc.scalar, ilevel, flags.has_key(), /*explicit_indentation*/has_leading_ws);
                    goto wrote_special;
                }
                // todo: check for escaped characters requiring double quotes
            }
            _write_scalar(sc.scalar, flags.is_quoted());
        wrote_special:
            ;
        }
    }
    else
    {
        _RYML_CB_ERR(m_tree->callbacks(), "not implemented");
    }
}